

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::ZSTDStorage::StringInitAnalyze(ColumnData *col_data,PhysicalType type)

{
  _func_int *p_Var1;
  StorageManager *pSVar2;
  idx_t iVar3;
  DBConfig *pDVar4;
  _func_int **pp_Var5;
  ZSTD_CCtx *pZVar6;
  undefined7 in_register_00000031;
  
  pSVar2 = ColumnData::GetStorageManager((ColumnData *)CONCAT71(in_register_00000031,type));
  iVar3 = optional_idx::GetIndex(&pSVar2->storage_version);
  if (iVar3 < 4) {
    col_data->_vptr_ColumnData = (_func_int **)0x0;
    pp_Var5 = (_func_int **)0x0;
  }
  else {
    p_Var1 = *(_func_int **)(CONCAT71(in_register_00000031,type) + 0x18);
    pDVar4 = DBConfig::Get((AttachedDatabase *)
                           **(undefined8 **)(CONCAT71(in_register_00000031,type) + 0x20));
    pp_Var5 = (_func_int **)operator_new(0x50);
    pp_Var5[1] = p_Var1;
    *pp_Var5 = (_func_int *)&PTR__ZSTDAnalyzeState_024b3b48;
    pp_Var5[2] = (_func_int *)pDVar4;
    pp_Var5[3] = (_func_int *)0x0;
    pp_Var5[4] = (_func_int *)0x0;
    pp_Var5[5] = (_func_int *)0x0;
    pp_Var5[6] = (_func_int *)0x0;
    pp_Var5[7] = (_func_int *)0x0;
    pp_Var5[8] = (_func_int *)0x0;
    pp_Var5[9] = (_func_int *)0x0;
    pZVar6 = duckdb_zstd::ZSTD_createCCtx();
    pp_Var5[3] = (_func_int *)pZVar6;
  }
  col_data->_vptr_ColumnData = pp_Var5;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> ZSTDStorage::StringInitAnalyze(ColumnData &col_data, PhysicalType type) {
	// check if the storage version we are writing to supports sztd
	auto &storage = col_data.GetStorageManager();
	if (storage.GetStorageVersion() < 4) {
		// compatibility mode with old versions - disable zstd
		return nullptr;
	}
	CompressionInfo info(col_data.GetBlockManager());
	auto &data_table_info = col_data.info;
	auto &attached_db = data_table_info.GetDB();
	auto &config = DBConfig::Get(attached_db);

	return make_uniq<ZSTDAnalyzeState>(info, config);
}